

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<char> * __thiscall
llvm::SmallVectorImpl<char>::operator=(SmallVectorImpl<char> *this,SmallVectorImpl<char> *RHS)

{
  void *pvVar1;
  char *pcVar2;
  void *pvVar3;
  iterator MinSize;
  size_t sVar4;
  iterator pcVar5;
  char *local_b8;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<char> *RHS_local;
  SmallVectorImpl<char> *this_local;
  
  if (this != RHS) {
    MinSize = (iterator)SmallVectorBase::size((SmallVectorBase *)RHS);
    NewEnd = (iterator)SmallVectorBase::size((SmallVectorBase *)this);
    if (NewEnd < MinSize) {
      pcVar5 = (iterator)SmallVectorBase::capacity((SmallVectorBase *)this);
      if (pcVar5 < MinSize) {
        pcVar2 = (char *)(this->super_SmallVectorTemplateBase<char,_true>).
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        pvVar1 = (this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        sVar4 = SmallVectorBase::size((SmallVectorBase *)this);
        SmallVectorTemplateBase<char,_true>::destroy_range(pcVar2,(char *)((long)pvVar1 + sVar4));
        SmallVectorBase::set_size((SmallVectorBase *)this,0);
        NewEnd = (iterator)0x0;
        SmallVectorTemplateBase<char,_true>::grow
                  (&this->super_SmallVectorTemplateBase<char,_true>,(size_t)MinSize);
      }
      else if (NewEnd != (iterator)0x0) {
        std::copy<char_const*,char*>
                  ((char *)(RHS->super_SmallVectorTemplateBase<char,_true>).
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                   NewEnd + (long)(RHS->super_SmallVectorTemplateBase<char,_true>).
                                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                  BeginX,
                   (char *)(this->super_SmallVectorTemplateBase<char,_true>).
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX)
        ;
      }
      pvVar1 = (RHS->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      pvVar3 = (RHS->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      sVar4 = SmallVectorBase::size((SmallVectorBase *)RHS);
      SmallVectorTemplateBase<char,true>::uninitialized_copy<char_const,char>
                (NewEnd + (long)pvVar1,(char *)((long)pvVar3 + sVar4),
                 NewEnd + (long)(this->super_SmallVectorTemplateBase<char,_true>).
                                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                BeginX,(type *)0x0);
      SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
    }
    else {
      if (MinSize == (iterator)0x0) {
        local_b8 = (char *)(this->super_SmallVectorTemplateBase<char,_true>).
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      }
      else {
        local_b8 = std::copy<char_const*,char*>
                             ((char *)(RHS->super_SmallVectorTemplateBase<char,_true>).
                                      super_SmallVectorTemplateCommon<char,_void>.
                                      super_SmallVectorBase.BeginX,
                              MinSize + (long)(RHS->super_SmallVectorTemplateBase<char,_true>).
                                              super_SmallVectorTemplateCommon<char,_void>.
                                              super_SmallVectorBase.BeginX,
                              (char *)(this->super_SmallVectorTemplateBase<char,_true>).
                                      super_SmallVectorTemplateCommon<char,_void>.
                                      super_SmallVectorBase.BeginX);
      }
      pvVar1 = (this->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      sVar4 = SmallVectorBase::size((SmallVectorBase *)this);
      SmallVectorTemplateBase<char,_true>::destroy_range(local_b8,(char *)((long)pvVar1 + sVar4));
      SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->set_size(RHSSize);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);
  return *this;
}